

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

u32 GF2::Env::Ticks(void)

{
  timespec ts;
  timespec local_18;
  
  clock_gettime(1,&local_18);
  return (int)local_18.tv_sec * 1000 +
         ((int)(SUB168(SEXT816(0x431bde82d7b634db) * SEXT816(local_18.tv_nsec),8) >> 0x12) -
         (SUB164(SEXT816(0x431bde82d7b634db) * SEXT816(local_18.tv_nsec),0xc) >> 0x1f));
}

Assistant:

u32 Env::Ticks()
{
	u32 ticks = 0;
#if defined OS_WIN
	ticks = (u32)::GetTickCount();
#elif defined OS_LINUX
	timespec ts;
    ::clock_gettime(CLOCK_MONOTONIC, &ts);
    ticks = ts.tv_nsec / 1000000;
    ticks += ts.tv_sec * 1000;
#elif defined OS_APPLE
	clock_serv_t cclock;
	mach_timespec_t mts;
	host_get_clock_service(mach_host_self(), CALENDAR_CLOCK, &cclock);
	clock_get_time(cclock, &mts);
	mach_port_deallocate(mach_task_self(), cclock);
    ticks = mts.tv_nsec / 1000000;
    ticks += mts.tv_sec * 1000;
#endif
	return ticks;
}